

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int ecjpake_mul_secret(mbedtls_mpi *R,int sign,mbedtls_mpi *X,mbedtls_mpi *S,mbedtls_mpi *N,
                      _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  undefined1 local_50 [8];
  mbedtls_mpi b;
  int ret;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_mpi *N_local;
  mbedtls_mpi *S_local;
  mbedtls_mpi *X_local;
  int sign_local;
  mbedtls_mpi *R_local;
  
  b._12_4_ = 0xffffff92;
  mbedtls_mpi_init((mbedtls_mpi *)local_50);
  b._12_4_ = mbedtls_mpi_fill_random((mbedtls_mpi *)local_50,0x10,f_rng,p_rng);
  if ((((b._12_4_ == 0) &&
       (b._12_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)local_50,(mbedtls_mpi *)local_50,N),
       b._12_4_ == 0)) &&
      (b._12_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)local_50,(mbedtls_mpi *)local_50,S),
      b._12_4_ == 0)) &&
     (b._12_4_ = mbedtls_mpi_mul_mpi(R,X,(mbedtls_mpi *)local_50), b._12_4_ == 0)) {
    R->s = R->s * (short)sign;
    b._12_4_ = mbedtls_mpi_mod_mpi(R,R,N);
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_50);
  return b._12_4_;
}

Assistant:

static int ecjpake_mul_secret(mbedtls_mpi *R, int sign,
                              const mbedtls_mpi *X,
                              const mbedtls_mpi *S,
                              const mbedtls_mpi *N,
                              int (*f_rng)(void *, unsigned char *, size_t),
                              void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi b; /* Blinding value, then s + N * blinding */

    mbedtls_mpi_init(&b);

    /* b = s + rnd-128-bit * N */
    MBEDTLS_MPI_CHK(mbedtls_mpi_fill_random(&b, 16, f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&b, &b, N));
    MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&b, &b, S));

    /* R = sign * X * b mod N */
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(R, X, &b));
    R->s *= sign;
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(R, R, N));

cleanup:
    mbedtls_mpi_free(&b);

    return ret;
}